

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O3

void __thiscall ACustomBridge::Destroy(ACustomBridge *this)

{
  DObject *pDVar1;
  DThinker *pDVar2;
  TThinkerIterator<AActor> it;
  FThinkerIterator FStack_28;
  
  FThinkerIterator::FThinkerIterator(&FStack_28,AActor::RegistrationInfo.MyClass,0x80);
  pDVar2 = FThinkerIterator::Next(&FStack_28,false);
  while (pDVar2 != (DThinker *)0x0) {
    pDVar1 = pDVar2[9].super_DObject.ObjNext;
    if (pDVar1 != (DObject *)0x0) {
      if ((pDVar1->ObjectFlags & 0x20) == 0) {
        if (pDVar1 == (DObject *)this) {
          (*(pDVar2->super_DObject)._vptr_DObject[4])(pDVar2);
        }
      }
      else {
        pDVar2[9].super_DObject.ObjNext = (DObject *)0x0;
      }
    }
    pDVar2 = FThinkerIterator::Next(&FStack_28,false);
  }
  AActor::Destroy(&this->super_AActor);
  return;
}

Assistant:

void ACustomBridge::Destroy()
{
	// Hexen originally just set a flag to make the bridge balls remove themselves in A_BridgeOrbit.
	// But this is not safe with custom bridge balls that do not necessarily call that function.
	// So the best course of action is to look for all bridge balls here and destroy them ourselves.
	
	TThinkerIterator<AActor> it;
	AActor *thing;
	
	while ((thing = it.Next()))
	{
		if (thing->target == this)
		{
			thing->Destroy();
		}
	}
	Super::Destroy();
}